

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O3

void __thiscall
Vault::Client::Client(Client *this,Config *config,AuthenticationStrategy *authStrategy)

{
  pointer pcVar1;
  optional<Vault::AuthenticationResponse> result;
  _Optional_payload_base<Vault::AuthenticationResponse> local_128;
  Config local_e0;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_001c28b0;
  this->debug_ = config->debug_;
  this->tls_ = config->tls_;
  (this->host_).value_._M_dataplus._M_p = (pointer)&(this->host_).value_.field_2;
  pcVar1 = (config->host_).value_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host_,pcVar1,pcVar1 + (config->host_).value_._M_string_length);
  (this->port_).value_._M_dataplus._M_p = (pointer)&(this->port_).value_.field_2;
  pcVar1 = (config->port_).value_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->port_,pcVar1,pcVar1 + (config->port_).value_._M_string_length);
  (this->token_).value_._M_dataplus._M_p = (pointer)&(this->token_).value_.field_2;
  (this->token_).value_._M_string_length = 0;
  (this->token_).value_.field_2._M_local_buf[0] = '\0';
  (this->namespace_).value_._M_dataplus._M_p = (pointer)&(this->namespace_).value_.field_2;
  pcVar1 = (config->ns_).value_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->namespace_,pcVar1,pcVar1 + (config->ns_).value_._M_string_length);
  Config::Config(&local_e0,config);
  HttpClient::HttpClient(&this->httpClient_,&local_e0);
  std::filesystem::__cxx11::path::~path(&local_e0.caBundle_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.ns_.value_._M_dataplus._M_p != &local_e0.ns_.value_.field_2) {
    operator_delete(local_e0.ns_.value_._M_dataplus._M_p,
                    local_e0.ns_.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.port_.value_._M_dataplus._M_p != &local_e0.port_.value_.field_2) {
    operator_delete(local_e0.port_.value_._M_dataplus._M_p,
                    local_e0.port_.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.host_.value_._M_dataplus._M_p != &local_e0.host_.value_.field_2) {
    operator_delete(local_e0.host_.value_._M_dataplus._M_p,
                    local_e0.host_.value_.field_2._M_allocated_capacity + 1);
  }
  this->authStrategy_ = authStrategy;
  std::filesystem::__cxx11::path::path(&this->caBundle_,&config->caBundle_);
  (*this->authStrategy_->_vptr_AuthenticationStrategy[2])(&local_128,this->authStrategy_,this);
  if (local_128._M_engaged == true) {
    std::__cxx11::string::_M_assign((string *)&this->token_);
  }
  if ((local_128._M_engaged & 1U) != 0) {
    std::_Optional_payload_base<Vault::AuthenticationResponse>::_M_destroy(&local_128);
  }
  return;
}

Assistant:

Vault::Client::Client(Vault::Config &config,
                      AuthenticationStrategy &authStrategy)
    : debug_(config.getDebug())
    , tls_(config.getTls())
    , host_(config.getHost())
    , port_(config.getPort())
    , namespace_(config.getNamespace())
    , httpClient_(HttpClient(config))
    , authStrategy_(authStrategy)
    , caBundle_(config.getCaBundle()) {
  if (auto result = authStrategy_.authenticate(*this)) {
    token_ = result.value().token;
  }
}